

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall wabt::interp::Thread::DoSimdRelaxedNmadd<float>(Thread *this)

{
  u8 i;
  long lVar1;
  Simd<float,_(unsigned_char)__x04_> SVar2;
  SS result;
  Simd<float,_(unsigned_char)__x04_> a;
  Simd<float,_(unsigned_char)__x04_> b;
  Simd<float,_(unsigned_char)__x04_> c;
  anon_union_16_6_113bff37_for_Value_0 local_48;
  float local_38 [4];
  float local_28 [4];
  float local_18 [4];
  
  local_18 = (float  [4])Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  local_28 = (float  [4])Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  SVar2 = Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  local_38[0] = SVar2.v[0];
  local_38[1] = SVar2.v[1];
  local_38[2] = SVar2.v[2];
  local_38[3] = SVar2.v[3];
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    *(float *)((long)&local_48 + lVar1 * 4) = local_18[lVar1] - local_38[lVar1] * local_28[lVar1];
  }
  Push(this,(Value)local_48.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdRelaxedNmadd() {
  using SS = typename Simd128<S>::Type;
  auto c = Pop<SS>();
  auto b = Pop<SS>();
  auto a = Pop<SS>();
  SS result;
  for (u8 i = 0; i < SS::lanes; ++i) {
    result[i] = -(a[i] * b[i]) + c[i];
  }
  Push(result);
  return RunResult::Ok;
}